

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

SVInt slang::SVInt::concat(span<const_slang::SVInt,_18446744073709551615UL> operands)

{
  byte bVar1;
  uint length;
  uint64_t *puVar2;
  long lVar3;
  void *__s;
  uint uVar4;
  long in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  uint64_t *src;
  undefined8 extraout_RDX_01;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar5;
  undefined8 extraout_RDX_02;
  undefined8 uVar6;
  uint32_t uVar7;
  __extent_storage<18446744073709551615UL> _Var8;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 this;
  long lVar9;
  byte bVar10;
  byte bVar11;
  uint64_t *puVar12;
  bitwidth_t bits;
  SVInt SVar13;
  uint64_t val;
  uint64_t local_38;
  
  _Var8 = operands._M_extent._M_extent_value;
  this.val = (uint64_t)operands._M_ptr;
  if (in_RDX == 0) {
    SVInt((SVInt *)this.pVal,(SVIntStorage *)Zero);
    uVar6 = extraout_RDX_00;
  }
  else {
    lVar9 = in_RDX << 4;
    lVar3 = 0;
    bits = 0;
    bVar11 = 0;
    do {
      bits = bits + *(int *)(_Var8._M_extent_value + 8 + lVar3);
      bVar1 = *(byte *)(_Var8._M_extent_value + 0xd + lVar3);
      bVar10 = bVar11 & 1;
      bVar11 = bVar10 | bVar1;
      lVar3 = lVar3 + 0x10;
    } while (lVar9 != lVar3);
    uVar4 = (bits + 0x3f >> 6) << (bVar10 | bVar1 & 0x1f);
    if (bits == 0 || uVar4 == 1) {
      local_38 = 0;
      lVar3 = in_RDX * -0x10;
      uVar7 = 0;
      puVar12 = (uint64_t *)(_Var8._M_extent_value + in_RDX * 0x10);
      do {
        bitcpy(&local_38,uVar7,puVar12 + -2,(uint32_t)puVar12[-1],0);
        uVar7 = uVar7 + (int)puVar12[-1];
        lVar3 = lVar3 + 0x10;
        puVar12 = puVar12 + -2;
      } while (lVar3 != 0);
      SVInt((SVInt *)this.pVal,bits,local_38,false);
      uVar6 = extraout_RDX;
    }
    else {
      __s = operator_new__((ulong)(uVar4 * 8));
      uVar7 = 0;
      memset(__s,0,(ulong)(uVar4 * 8));
      *this.pVal = (uint64_t)__s;
      *(bitwidth_t *)(this.val + 8) = bits;
      *(bool *)(this.val + 0xc) = false;
      *(byte *)(this.val + 0xd) = bVar11;
      do {
        aVar5.val = this.val;
        if ((*(bool *)(this.val + 0xd) & 1U) != 0) {
          aVar5.val = *this.pVal;
        }
        if (0x40 < *(bitwidth_t *)(this.val + 8)) {
          aVar5.val = *this.pVal;
        }
        puVar12 = (uint64_t *)((_Var8._M_extent_value - 0x10) + lVar9);
        puVar2 = *(uint64_t **)((_Var8._M_extent_value - 0x10) + lVar9);
        src = puVar12;
        if ((*(byte *)((_Var8._M_extent_value - 3) + lVar9) & 1) != 0) {
          src = puVar2;
        }
        length = *(uint *)((_Var8._M_extent_value - 8) + lVar9);
        if (0x40 < length) {
          src = puVar2;
        }
        bitcpy(aVar5.pVal,uVar7,src,length,0);
        uVar6 = extraout_RDX_01;
        if (*(char *)((_Var8._M_extent_value - 3) + lVar9) == '\x01') {
          aVar5.val = this.val;
          if ((*(bool *)(this.val + 0xd) & 1U) != 0) {
            aVar5.pVal = (uint64_t *)*this.pVal;
          }
          if (0x40 < *(bitwidth_t *)(this.val + 8)) {
            aVar5.pVal = (uint64_t *)*this.pVal;
          }
          bitcpy(aVar5.pVal + (uVar4 >> 1),uVar7,
                 (uint64_t *)((ulong)((uint32_t)puVar12[1] + 0x3f >> 6) * 8 + *puVar12),
                 (uint32_t)puVar12[1],0);
          uVar6 = extraout_RDX_02;
        }
        uVar7 = uVar7 + (int)puVar12[1];
        lVar9 = lVar9 + -0x10;
      } while (lVar9 != 0);
    }
  }
  SVar13.super_SVIntStorage.bitWidth = (int)uVar6;
  SVar13.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar6 >> 0x20);
  SVar13.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar6 >> 0x28);
  SVar13.super_SVIntStorage._14_2_ = (short)((ulong)uVar6 >> 0x30);
  SVar13.super_SVIntStorage.field_0.pVal = (uint64_t *)this.val;
  return (SVInt)SVar13.super_SVIntStorage;
}

Assistant:

SVInt SVInt::concat(std::span<SVInt const> operands) {
    // 0 operand concatenations can be valid inside of larger concatenations.
    if (operands.size() == 0)
        return SVInt::Zero;

    // First, compute how many bits total we are dealing with.
    bitwidth_t bits = 0;
    bool isUnknown = false;
    for (const auto& op : operands) {
        bits += op.bitWidth;
        isUnknown |= op.unknownFlag;
    }

    uint32_t words = SVInt::getNumWords(bits, isUnknown);
    if (words == 1 || bits == 0) {
        // The concatenation still fits into a single word.
        bitwidth_t offset = 0;
        uint64_t val = 0;

        // The first operand writes the msb, so operate in reverse.
        for (auto it = operands.rbegin(); it != operands.rend(); it++) {
            bitcpy(&val, offset, &it->val, it->bitWidth);
            offset += it->bitWidth;
        }
        return SVInt(bits, val, false);
    }

    // Result data is zeroed out, which is the proper default, so it doesn't
    // matter that we may not write to certain unknown words or might not
    // write all the way to the end.
    SVInt result = SVInt::allocZeroed(bits, false, isUnknown);

    bitwidth_t offset = 0;
    for (auto it = operands.rbegin(); it != operands.rend(); it++) {
        bitcpy(result.getRawData(), offset, it->getRawData(), it->bitWidth);
        if (it->unknownFlag) {
            bitcpy(result.getRawData() + words / 2, offset, it->pVal + it->getNumWords() / 2,
                   it->bitWidth);
        }
        offset += it->bitWidth;
    }

    return result;
}